

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O2

idx_t duckdb::ColumnSegment::FilterSelection
                (SelectionVector *sel,Vector *vector,UnifiedVectorFormat *vdata,TableFilter *filter,
                TableFilterState *filter_state,idx_t scan_count,idx_t *approved_tuple_count)

{
  PhysicalType PVar1;
  byte bVar2;
  data_t dVar3;
  uint16_t uVar4;
  ushort uVar5;
  short sVar6;
  uint32_t uVar7;
  int iVar8;
  long lVar9;
  data_ptr_t pdVar10;
  uint64_t uVar11;
  sel_t *psVar12;
  SelectionVector *pSVar13;
  hugeint_t hVar14;
  hugeint_t hVar15;
  hugeint_t hVar16;
  hugeint_t hVar17;
  bool bVar18;
  byte bVar19;
  data_t dVar20;
  bool bVar21;
  uint16_t uVar22;
  int16_t iVar23;
  int32_t iVar24;
  uint32_t uVar25;
  ConstantFilter *pCVar26;
  ConjunctionAndFilter *pCVar27;
  const_reference pvVar28;
  reference pvVar29;
  type pTVar30;
  StructFilter *pSVar31;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  pointer this_01;
  type vector_00;
  type pTVar32;
  idx_t iVar33;
  ConjunctionOrFilter *pCVar34;
  ulong uVar35;
  int64_t iVar36;
  uint64_t uVar37;
  string *value;
  InternalException *pIVar38;
  InvalidTypeException *this_02;
  NotImplementedException *pNVar39;
  idx_t iVar40;
  uint uVar41;
  bool *vec_1;
  ulong uVar42;
  idx_t i_4;
  idx_t iVar43;
  long lVar44;
  ValidityMask *pVVar45;
  idx_t iVar46;
  idx_t iVar47;
  bool *vec;
  idx_t i_15;
  element_type *peVar48;
  idx_t i;
  sel_t *psVar49;
  idx_t result_count;
  idx_t iVar50;
  ValidityMask *mask;
  ulong uVar51;
  ulong uVar52;
  float fVar53;
  hugeint_t hVar54;
  uhugeint_t uVar55;
  bool *vec_5;
  ValidityMask *mask_1;
  idx_t local_f0;
  SelectionVector new_sel;
  UnifiedVectorFormat child_data;
  allocator local_71;
  string_t predicate;
  undefined1 local_60 [8];
  idx_t offset;
  idx_t chunk_end;
  SelectionVector current_sel;
  
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
    pCVar26 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    PVar1 = (vector->type).physical_type_;
    switch(PVar1) {
    case BOOL:
      bVar18 = BooleanValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar20 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((bool)dVar20 == bVar18);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = (ulong)((bool)pdVar10[iVar46] == bVar18);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar20 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((bool)dVar20 != bVar18);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = (ulong)((bool)pdVar10[iVar46] != bVar18);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((bVar2 ^ 1) & bVar18);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = (ulong)((pdVar10[iVar46] ^ 1) & bVar18);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = 0;
            if (!bVar18) {
              uVar51 = (ulong)pdVar10[iVar46];
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = 0;
              if (!bVar18) {
                uVar51 = (ulong)pdVar10[iVar46];
              }
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = (ulong)pdVar10[iVar46] ^ 1;
            if (bVar18) {
              uVar51 = 1;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = (ulong)pdVar10[iVar46] ^ 1;
              if (bVar18) {
                uVar51 = 1;
              }
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (bVar2 | !bVar18);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar21 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar21) {
              uVar51 = (ulong)(pdVar10[iVar46] | !bVar18);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case UINT8:
      bVar19 = UTinyIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (bVar2 == bVar19);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] == bVar19);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (bVar2 != bVar19);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] != bVar19);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (bVar2 < bVar19);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] < bVar19);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (bVar19 < bVar2);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(bVar19 < pdVar10[iVar46]);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(bVar19 < bVar2);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] <= bVar19);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            bVar2 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(bVar2 < bVar19);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(bVar19 <= pdVar10[iVar46]);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case INT8:
      dVar20 = TinyIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (dVar3 == dVar20);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] == dVar20);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (dVar3 != dVar20);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(pdVar10[iVar46] != dVar20);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((char)dVar3 < (char)dVar20);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)((char)pdVar10[iVar46] < (char)dVar20);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((char)dVar20 < (char)dVar3);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)((char)dVar20 < (char)pdVar10[iVar46]);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((char)dVar3 <= (char)dVar20);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)((char)pdVar10[iVar46] <= (char)dVar20);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            dVar3 = pdVar10[iVar46];
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + ((char)dVar20 <= (char)dVar3);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)((char)dVar20 <= (char)pdVar10[iVar46]);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case UINT16:
      uVar22 = USmallIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar4 = *(uint16_t *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar4 == uVar22);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint16_t *)(pdVar10 + iVar46 * 2) == uVar22);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar4 = *(uint16_t *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar4 != uVar22);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint16_t *)(pdVar10 + iVar46 * 2) != uVar22);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar5 = *(ushort *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar5 < uVar22);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(ushort *)(pdVar10 + iVar46 * 2) < uVar22);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar5 = *(ushort *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar22 < uVar5);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar22 < *(ushort *)(pdVar10 + iVar46 * 2));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar5 = *(ushort *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar22 < uVar5);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(ushort *)(pdVar10 + iVar46 * 2) <= uVar22);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar5 = *(ushort *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar5 < uVar22);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar22 <= *(ushort *)(pdVar10 + iVar46 * 2));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case INT16:
      iVar23 = SmallIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (sVar6 == iVar23);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(short *)(pdVar10 + iVar46 * 2) == iVar23);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (sVar6 != iVar23);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(short *)(pdVar10 + iVar46 * 2) != iVar23);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (sVar6 < iVar23);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(short *)(pdVar10 + iVar46 * 2) < iVar23);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar23 < sVar6);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar23 < *(short *)(pdVar10 + iVar46 * 2));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (sVar6 <= iVar23);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(short *)(pdVar10 + iVar46 * 2) <= iVar23);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            sVar6 = *(short *)(pdVar10 + iVar46 * 2);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar23 <= sVar6);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar23 <= *(short *)(pdVar10 + iVar46 * 2));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case UINT32:
      uVar25 = UIntegerValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar7 = *(uint32_t *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar7 == uVar25);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint32_t *)(pdVar10 + iVar46 * 4) == uVar25);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar7 = *(uint32_t *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar7 != uVar25);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint32_t *)(pdVar10 + iVar46 * 4) != uVar25);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar41 = *(uint *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar41 < uVar25);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint *)(pdVar10 + iVar46 * 4) < uVar25);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar41 = *(uint *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar25 < uVar41);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar25 < *(uint *)(pdVar10 + iVar46 * 4));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar41 = *(uint *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar25 < uVar41);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint *)(pdVar10 + iVar46 * 4) <= uVar25);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar41 = *(uint *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar41 < uVar25);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar25 <= *(uint *)(pdVar10 + iVar46 * 4));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case INT32:
      iVar24 = IntegerValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar8 == iVar24);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(int *)(pdVar10 + iVar46 * 4) == iVar24);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar8 != iVar24);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(int *)(pdVar10 + iVar46 * 4) != iVar24);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar8 < iVar24);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(int *)(pdVar10 + iVar46 * 4) < iVar24);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar24 < iVar8);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar24 < *(int *)(pdVar10 + iVar46 * 4));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar8 <= iVar24);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(int *)(pdVar10 + iVar46 * 4) <= iVar24);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            iVar8 = *(int *)(pdVar10 + iVar46 * 4);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar24 <= iVar8);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar24 <= *(int *)(pdVar10 + iVar46 * 4));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case UINT64:
      uVar37 = UBigIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar11 = *(uint64_t *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar11 == uVar37);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint64_t *)(pdVar10 + iVar46 * 8) == uVar37);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar11 = *(uint64_t *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar11 != uVar37);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(uint64_t *)(pdVar10 + iVar46 * 8) != uVar37);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = *(ulong *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar51 < uVar37);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(ulong *)(pdVar10 + iVar46 * 8) < uVar37);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = *(ulong *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (uVar37 < uVar51);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar37 < *(ulong *)(pdVar10 + iVar46 * 8));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = *(ulong *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar37 < uVar51);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(ulong *)(pdVar10 + iVar46 * 8) <= uVar37);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            uVar51 = *(ulong *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = (iVar40 + 1) - (ulong)(uVar51 < uVar37);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(uVar37 <= *(ulong *)(pdVar10 + iVar46 * 8));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case INT64:
      iVar36 = BigIntValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (lVar44 == iVar36);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(long *)(pdVar10 + iVar46 * 8) == iVar36);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (lVar44 != iVar36);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(long *)(pdVar10 + iVar46 * 8) != iVar36);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (lVar44 < iVar36);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(long *)(pdVar10 + iVar46 * 8) < iVar36);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1c:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar36 < lVar44);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar36 < *(long *)(pdVar10 + iVar46 * 8));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1d:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (lVar44 <= iVar36);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(*(long *)(pdVar10 + iVar46 * 8) <= iVar36);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
        break;
      case 0x1e:
        iVar50 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar33];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar44 = *(long *)(pdVar10 + iVar46 * 8);
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + (iVar36 <= lVar44);
          }
        }
        else {
          iVar40 = 0;
          for (iVar33 = 0; iVar50 != iVar33; iVar33 = iVar33 + 1) {
            iVar43 = iVar33;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar33];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar51 = (ulong)(iVar36 <= *(long *)(pdVar10 + iVar46 * 8));
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar40] = (sel_t)iVar43;
            iVar40 = iVar40 + uVar51;
          }
        }
      }
      break;
    case UINT64|UINT8:
switchD_01541dd0_caseD_a:
      this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&child_data,"Invalid type for filter pushed down to table comparison",
                 (allocator *)&new_sel);
      InvalidTypeException::InvalidTypeException(this_02,&vector->type,(string *)&child_data);
      __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      fVar53 = FloatValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = duckdb::Equals::Operation<float>
                               ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = duckdb::Equals::Operation<float>
                                 ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1a:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = NotEquals::Operation<float>
                               ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = NotEquals::Operation<float>
                                 ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1b:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThan::Operation<float>
                               ((float *)&child_data,(float *)(pdVar10 + uVar35 * 4));
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThan::Operation<float>
                                 ((float *)&child_data,(float *)(pdVar10 + uVar35 * 4));
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1c:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThan::Operation<float>
                               ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThan::Operation<float>
                                 ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1d:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = LessThanEquals::Operation<float>
                               ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = LessThanEquals::Operation<float>
                                 ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1e:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThanEquals::Operation<float>
                               ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel._0_4_ = fVar53;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThanEquals::Operation<float>
                                 ((float *)(pdVar10 + uVar35 * 4),(float *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
      }
      goto LAB_015477fc;
    case DOUBLE:
      pSVar13 = (SelectionVector *)DoubleValue::Get(&pCVar26->constant);
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = duckdb::Equals::Operation<double>
                               ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = duckdb::Equals::Operation<double>
                                 ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1a:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = NotEquals::Operation<double>
                               ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = NotEquals::Operation<double>
                                 ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1b:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThan::Operation<double>
                               ((double *)&child_data,(double *)(pdVar10 + uVar35 * 8));
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThan::Operation<double>
                                 ((double *)&child_data,(double *)(pdVar10 + uVar35 * 8));
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1c:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThan::Operation<double>
                               ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThan::Operation<double>
                                 ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1d:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = LessThanEquals::Operation<double>
                               ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = LessThanEquals::Operation<double>
                                 ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1e:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThanEquals::Operation<double>
                               ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          child_data.sel = pSVar13;
          pdVar10 = vdata->data;
          iVar50 = 0;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThanEquals::Operation<double>
                                 ((double *)(pdVar10 + uVar35 * 8),(double *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
      }
LAB_015477fc:
      *approved_tuple_count = iVar50;
      goto LAB_01547808;
    default:
      if (PVar1 == VARCHAR) {
        value = StringValue::Get_abi_cxx11_(&pCVar26->constant);
        string_t::string_t(&predicate,value);
        bVar2 = (pCVar26->super_TableFilter).field_0x9;
        SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
        uVar41 = (uint)bVar2;
        if (5 < uVar41 - 0x19) {
          pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&child_data,
                     "Unknown comparison type for filter pushed down to table!",
                     (allocator *)&current_sel);
          NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
          __cxa_throw(pNVar39,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pVVar45 = &vdata->validity;
        switch(uVar41) {
        case 0x19:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = string_t::StringComparisonOperators::Equals
                                 ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = string_t::StringComparisonOperators::Equals
                                   ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1a:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = NotEquals::Operation<duckdb::string_t>
                                 ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = NotEquals::Operation<duckdb::string_t>
                                   ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1b:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = string_t::StringComparisonOperators::GreaterThan
                                 ((string_t *)&child_data,(string_t *)(pdVar10 + uVar35 * 0x10));
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)&child_data,(string_t *)(pdVar10 + uVar35 * 0x10));
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1c:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = string_t::StringComparisonOperators::GreaterThan
                                 ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1d:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = LessThanEquals::Operation<duckdb::string_t>
                                 ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = LessThanEquals::Operation<duckdb::string_t>
                                   ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1e:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = GreaterThanEquals::Operation<duckdb::string_t>
                                 ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            child_data.data = (data_ptr_t)predicate.value.pointer.ptr;
            child_data.sel = (SelectionVector *)predicate.value._0_8_;
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = GreaterThanEquals::Operation<duckdb::string_t>
                                   ((string_t *)(pdVar10 + uVar35 * 0x10),(string_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
        }
        goto LAB_015477fc;
      }
      if (PVar1 == UINT128) {
        uVar55 = UhugeIntValue::Get(&pCVar26->constant);
        bVar2 = (pCVar26->super_TableFilter).field_0x9;
        SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
        uVar41 = (uint)bVar2;
        if (5 < uVar41 - 0x19) {
          pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&child_data,
                     "Unknown comparison type for filter pushed down to table!",
                     (allocator *)&predicate);
          NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
          __cxa_throw(pNVar39,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pVVar45 = &vdata->validity;
        child_data._0_16_ = uVar55;
        switch(uVar41) {
        case 0x19:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = uhugeint_t::operator==
                                 ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),(uhugeint_t *)&child_data)
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = uhugeint_t::operator==
                                   ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),
                                    (uhugeint_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1a:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = NotEquals::Operation<duckdb::uhugeint_t>
                                 ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),(uhugeint_t *)&child_data)
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = NotEquals::Operation<duckdb::uhugeint_t>
                                   ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),
                                    (uhugeint_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1b:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = uhugeint_t::operator>
                                 ((uhugeint_t *)&child_data,(uhugeint_t *)(pdVar10 + uVar35 * 0x10))
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = uhugeint_t::operator>
                                   ((uhugeint_t *)&child_data,
                                    (uhugeint_t *)(pdVar10 + uVar35 * 0x10));
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1c:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = uhugeint_t::operator>
                                 ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),(uhugeint_t *)&child_data)
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = uhugeint_t::operator>
                                   ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),
                                    (uhugeint_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1d:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = LessThanEquals::Operation<duckdb::uhugeint_t>
                                 ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),(uhugeint_t *)&child_data)
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = LessThanEquals::Operation<duckdb::uhugeint_t>
                                   ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),
                                    (uhugeint_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
          break;
        case 0x1e:
          uVar51 = *approved_tuple_count;
          if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = GreaterThanEquals::Operation<duckdb::uhugeint_t>
                                 ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),(uhugeint_t *)&child_data)
              ;
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + bVar18;
            }
          }
          else {
            pdVar10 = vdata->data;
            iVar50 = 0;
            for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
              uVar42 = uVar52;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar42 = (ulong)sel->sel_vector[uVar52];
              }
              psVar49 = vdata->sel->sel_vector;
              uVar35 = uVar42;
              if (psVar49 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar49[uVar42];
              }
              bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
              if (bVar18) {
                bVar18 = GreaterThanEquals::Operation<duckdb::uhugeint_t>
                                   ((uhugeint_t *)(pdVar10 + uVar35 * 0x10),
                                    (uhugeint_t *)&child_data);
                uVar35 = (ulong)bVar18;
              }
              else {
                uVar35 = 0;
              }
              new_sel.sel_vector[iVar50] = (sel_t)uVar42;
              iVar50 = iVar50 + uVar35;
            }
          }
        }
        goto LAB_015477fc;
      }
      if (PVar1 != INT128) goto switchD_01541dd0_caseD_a;
      hVar54 = HugeIntValue::Get(&pCVar26->constant);
      lVar44 = hVar54.upper;
      uVar51 = hVar54.lower;
      bVar2 = (pCVar26->super_TableFilter).field_0x9;
      SelectionVector::SelectionVector(&new_sel,*approved_tuple_count);
      uVar41 = (uint)bVar2;
      if (5 < uVar41 - 0x19) {
        pNVar39 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_data,"Unknown comparison type for filter pushed down to table!",
                   (allocator *)&predicate);
        NotImplementedException::NotImplementedException(pNVar39,(string *)&child_data);
        __cxa_throw(pNVar39,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pVVar45 = &vdata->validity;
      switch(uVar41) {
      case 0x19:
        iVar33 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar40];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            hVar14.upper = *(int64_t *)(pdVar10 + iVar46 * 0x10 + 8);
            hVar14.lower = *(uint64_t *)(pdVar10 + iVar46 * 0x10);
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + (hVar54 == hVar14);
          }
        }
        else {
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar40];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              hVar16.upper = *(int64_t *)(pdVar10 + iVar46 * 0x10 + 8);
              hVar16.lower = *(uint64_t *)(pdVar10 + iVar46 * 0x10);
              uVar51 = (ulong)(hVar54 == hVar16);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + uVar51;
          }
        }
        break;
      case 0x1a:
        iVar33 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar40];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            hVar15.upper = *(int64_t *)(pdVar10 + iVar46 * 0x10 + 8);
            hVar15.lower = *(uint64_t *)(pdVar10 + iVar46 * 0x10);
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + (hVar54 != hVar15);
          }
        }
        else {
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar40];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              hVar17.upper = *(int64_t *)(pdVar10 + iVar46 * 0x10 + 8);
              hVar17.lower = *(uint64_t *)(pdVar10 + iVar46 * 0x10);
              uVar51 = (ulong)(hVar54 != hVar17);
            }
            else {
              uVar51 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + uVar51;
          }
        }
        break;
      case 0x1b:
        iVar33 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar40];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar9 = *(long *)(pdVar10 + iVar46 * 0x10 + 8);
            uVar52 = *(ulong *)(pdVar10 + iVar46 * 0x10);
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + (uVar52 < uVar51 && lVar9 == lVar44 || lVar9 < lVar44);
          }
        }
        else {
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar40];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              uVar52 = (ulong)(*(ulong *)(pdVar10 + iVar46 * 0x10) < uVar51 &&
                               *(long *)(pdVar10 + iVar46 * 0x10 + 8) == lVar44 ||
                              *(long *)(pdVar10 + iVar46 * 0x10 + 8) < lVar44);
            }
            else {
              uVar52 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + uVar52;
          }
        }
        break;
      case 0x1c:
        iVar33 = *approved_tuple_count;
        pdVar10 = vdata->data;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          psVar49 = sel->sel_vector;
          pSVar13 = vdata->sel;
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (psVar49 != (sel_t *)0x0) {
              iVar43 = (idx_t)psVar49[iVar40];
            }
            psVar12 = pSVar13->sel_vector;
            iVar46 = iVar43;
            if (psVar12 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar12[iVar43];
            }
            lVar9 = *(long *)(pdVar10 + iVar46 * 0x10 + 8);
            uVar52 = *(ulong *)(pdVar10 + iVar46 * 0x10);
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + (uVar51 < uVar52 && lVar9 == lVar44 ||
                              lVar9 != lVar44 && lVar44 <= lVar9);
          }
        }
        else {
          iVar50 = 0;
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            iVar43 = iVar40;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar43 = (idx_t)sel->sel_vector[iVar40];
            }
            psVar49 = vdata->sel->sel_vector;
            iVar46 = iVar43;
            if (psVar49 != (sel_t *)0x0) {
              iVar46 = (idx_t)psVar49[iVar43];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,iVar46);
            if (bVar18) {
              lVar9 = *(long *)(pdVar10 + iVar46 * 0x10 + 8);
              uVar52 = (ulong)(uVar51 < *(ulong *)(pdVar10 + iVar46 * 0x10) && lVar9 == lVar44 ||
                              lVar9 != lVar44 && lVar44 <= lVar9);
            }
            else {
              uVar52 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)iVar43;
            iVar50 = iVar50 + uVar52;
          }
        }
        break;
      case 0x1d:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar10 = vdata->data;
          iVar50 = 0;
          child_data._0_16_ = hVar54;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = LessThanEquals::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(pdVar10 + uVar35 * 0x10),(hugeint_t *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          pdVar10 = vdata->data;
          iVar50 = 0;
          child_data._0_16_ = hVar54;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = LessThanEquals::Operation<duckdb::hugeint_t>
                                 ((hugeint_t *)(pdVar10 + uVar35 * 0x10),(hugeint_t *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
        break;
      case 0x1e:
        uVar51 = *approved_tuple_count;
        if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar10 = vdata->data;
          iVar50 = 0;
          child_data._0_16_ = hVar54;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = GreaterThanEquals::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(pdVar10 + uVar35 * 0x10),(hugeint_t *)&child_data);
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + bVar18;
          }
        }
        else {
          pdVar10 = vdata->data;
          iVar50 = 0;
          child_data._0_16_ = hVar54;
          for (uVar52 = 0; uVar51 != uVar52; uVar52 = uVar52 + 1) {
            uVar42 = uVar52;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar42 = (ulong)sel->sel_vector[uVar52];
            }
            psVar49 = vdata->sel->sel_vector;
            uVar35 = uVar42;
            if (psVar49 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar49[uVar42];
            }
            bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar45->super_TemplatedValidityMask<unsigned_long>,uVar35);
            if (bVar18) {
              bVar18 = GreaterThanEquals::Operation<duckdb::hugeint_t>
                                 ((hugeint_t *)(pdVar10 + uVar35 * 0x10),(hugeint_t *)&child_data);
              uVar35 = (ulong)bVar18;
            }
            else {
              uVar35 = 0;
            }
            new_sel.sel_vector[iVar50] = (sel_t)uVar42;
            iVar50 = iVar50 + uVar35;
          }
        }
      }
      *approved_tuple_count = iVar50;
      goto LAB_01547808;
    }
    *approved_tuple_count = iVar40;
LAB_01547808:
    SelectionVector::Initialize(sel,&new_sel);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_01547821:
    return *approved_tuple_count;
  case IS_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      *approved_tuple_count = 0;
      return 0;
    }
    SelectionVector::SelectionVector((SelectionVector *)&child_data,*approved_tuple_count);
    iVar50 = 0;
    for (uVar51 = 0; uVar51 < *approved_tuple_count; uVar51 = uVar51 + 1) {
      uVar52 = uVar51;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar52 = (ulong)sel->sel_vector[uVar51];
      }
      psVar49 = vdata->sel->sel_vector;
      iVar33 = uVar52;
      if (psVar49 != (sel_t *)0x0) {
        iVar33 = (idx_t)psVar49[uVar52];
      }
      bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar33);
      if (!bVar18) {
        *(int *)((long)&(child_data.sel)->sel_vector + iVar50 * 4) = (int)uVar52;
        iVar50 = iVar50 + 1;
      }
    }
    break;
  case IS_NOT_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) goto LAB_01547821;
    SelectionVector::SelectionVector((SelectionVector *)&child_data,*approved_tuple_count);
    iVar50 = 0;
    for (uVar51 = 0; uVar51 < *approved_tuple_count; uVar51 = uVar51 + 1) {
      uVar52 = uVar51;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar52 = (ulong)sel->sel_vector[uVar51];
      }
      psVar49 = vdata->sel->sel_vector;
      iVar33 = uVar52;
      if (psVar49 != (sel_t *)0x0) {
        iVar33 = (idx_t)psVar49[uVar52];
      }
      bVar18 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar33);
      if (bVar18) {
        *(int *)((long)&(child_data.sel)->sel_vector + iVar50 * 4) = (int)uVar52;
        iVar50 = iVar50 + 1;
      }
    }
    break;
  case CONJUNCTION_OR:
    SelectionVector::SelectionVector((SelectionVector *)&child_data,*approved_tuple_count);
    pCVar34 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    iVar50 = 0;
    for (uVar51 = 0;
        uVar51 < (ulong)((long)(pCVar34->super_ConjunctionFilter).child_filters.
                               super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar34->super_ConjunctionFilter).child_filters.
                               super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar51 = uVar51 + 1)
    {
      pvVar28 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                ::get<true>(&(pCVar34->super_ConjunctionFilter).child_filters,uVar51);
      pTVar32 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(pvVar28);
      new_sel.sel_vector = (sel_t *)0x0;
      new_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      new_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      SelectionVector::Initialize(&new_sel,sel);
      predicate.value._0_8_ = *approved_tuple_count;
      pvVar29 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                             *)(filter_state + 1),uVar51);
      pTVar30 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                ::operator*(pvVar29);
      iVar33 = FilterSelection(&new_sel,vector,vdata,pTVar32,pTVar30,scan_count,(idx_t *)&predicate)
      ;
      for (iVar40 = 0; iVar40 != iVar33; iVar40 = iVar40 + 1) {
        iVar43 = iVar40;
        if (new_sel.sel_vector != (sel_t *)0x0) {
          iVar43 = (idx_t)new_sel.sel_vector[iVar40];
        }
        iVar46 = 0;
        do {
          if (iVar50 == iVar46) {
            *(int *)((long)&(child_data.sel)->sel_vector + iVar50 * 4) = (int)iVar43;
            iVar50 = iVar50 + 1;
            break;
          }
          iVar47 = iVar46;
          if (child_data.sel != (SelectionVector *)0x0) {
            iVar47 = (idx_t)*(uint *)((long)&(child_data.sel)->sel_vector + iVar46 * 4);
          }
          iVar46 = iVar46 + 1;
        } while (iVar47 != iVar43);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    break;
  case CONJUNCTION_AND:
    pCVar27 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    for (uVar51 = 0;
        uVar51 < (ulong)((long)(pCVar27->super_ConjunctionFilter).child_filters.
                               super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar27->super_ConjunctionFilter).child_filters.
                               super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar51 = uVar51 + 1)
    {
      pvVar28 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                ::get<true>(&(pCVar27->super_ConjunctionFilter).child_filters,uVar51);
      pTVar32 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(pvVar28);
      pvVar29 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                             *)(filter_state + 1),uVar51);
      pTVar30 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                ::operator*(pvVar29);
      FilterSelection(sel,vector,vdata,pTVar32,pTVar30,scan_count,approved_tuple_count);
    }
    goto LAB_01547821;
  case STRUCT_EXTRACT:
    pSVar31 = TableFilter::Cast<duckdb::StructFilter>(filter);
    this = StructVector::GetEntries(vector);
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,pSVar31->child_idx);
    UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
    this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (this_00);
    Vector::ToUnifiedFormat(this_01,scan_count,&child_data);
    vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
    pTVar32 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pSVar31->child_filter);
    iVar50 = FilterSelection(sel,vector_00,&child_data,pTVar32,filter_state,scan_count,
                             approved_tuple_count);
    UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
    return iVar50;
  case OPTIONAL_FILTER:
    return scan_count;
  default:
    pIVar38 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_data,"FIXME: unsupported type for filter selection",
               (allocator *)&new_sel);
    InternalException::InternalException(pIVar38,(string *)&child_data);
    __cxa_throw(pIVar38,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPRESSION_FILTER:
    SelectionVector::SelectionVector((SelectionVector *)&predicate,*approved_tuple_count);
    if (scan_count < 0x801) {
      DataChunk::DataChunk((DataChunk *)&child_data);
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&child_data,vector);
      child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)scan_count;
      iVar50 = ExpressionExecutor::SelectExpression
                         ((ExpressionExecutor *)(filter_state + 1),(DataChunk *)&child_data,
                          (SelectionVector *)&predicate,
                          (optional_ptr<duckdb::SelectionVector,_true>)sel,*approved_tuple_count);
      *approved_tuple_count = iVar50;
      DataChunk::~DataChunk((DataChunk *)&child_data);
    }
    else {
      offset = 0;
      SelectionVector::SelectionVector(&current_sel,*approved_tuple_count);
      local_f0 = 0;
      lVar44 = 0;
      while (peVar48 = (element_type *)(scan_count - offset),
            offset <= scan_count && peVar48 != (element_type *)0x0) {
        if ((element_type *)0x7ff < peVar48) {
          peVar48 = (element_type *)0x800;
        }
        chunk_end = (long)&(peVar48->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false> + offset;
        DataChunk::DataChunk((DataChunk *)&child_data);
        ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
        emplace_back<duckdb::Vector&,unsigned_long&,unsigned_long&>
                  ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&child_data,vector,
                   &offset,&chunk_end);
        uVar51 = *approved_tuple_count;
        psVar49 = sel->sel_vector;
        for (iVar50 = 0; uVar52 = iVar50 + lVar44,
            child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar48, uVar52 < uVar51; iVar50 = iVar50 + 1) {
          if (psVar49 != (sel_t *)0x0) {
            uVar52 = (ulong)psVar49[lVar44 + iVar50];
          }
          if (chunk_end <= uVar52) break;
          if (uVar52 < offset) {
            pIVar38 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&new_sel,"sel_index < offset in expression filter",&local_71);
            InternalException::InternalException(pIVar38,(string *)&new_sel);
            __cxa_throw(pIVar38,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          current_sel.sel_vector[iVar50] = (int)uVar52 - (int)offset;
        }
        if (iVar50 == 0) {
          offset = (long)&(peVar48->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false> + offset;
        }
        else {
          psVar49 = (sel_t *)(local_f0 * 4 + predicate.value._0_8_);
          SelectionVector::SelectionVector(&new_sel,psVar49);
          iVar33 = ExpressionExecutor::SelectExpression
                             ((ExpressionExecutor *)(filter_state + 1),(DataChunk *)&child_data,
                              &new_sel,&current_sel,iVar50);
          for (iVar40 = 0; iVar33 != iVar40; iVar40 = iVar40 + 1) {
            psVar12 = psVar49 + iVar40;
            *psVar12 = *psVar12 + (int)offset;
          }
          local_f0 = local_f0 + iVar33;
          offset = (long)&(peVar48->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false> + offset;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&new_sel.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        lVar44 = lVar44 + iVar50;
        DataChunk::~DataChunk((DataChunk *)&child_data);
      }
      *approved_tuple_count = local_f0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&current_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    SelectionVector::Initialize(sel,(SelectionVector *)&predicate);
    iVar50 = *approved_tuple_count;
    pVVar45 = (ValidityMask *)local_60;
    goto LAB_01542429;
  }
  SelectionVector::Initialize(sel,(SelectionVector *)&child_data);
  *approved_tuple_count = iVar50;
  pVVar45 = &child_data.validity;
LAB_01542429:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pVVar45);
  return iVar50;
}

Assistant:

idx_t ColumnSegment::FilterSelection(SelectionVector &sel, Vector &vector, UnifiedVectorFormat &vdata,
                                     const TableFilter &filter, TableFilterState &filter_state, idx_t scan_count,
                                     idx_t &approved_tuple_count) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER: {
		return scan_count;
	}
	case TableFilterType::CONJUNCTION_OR: {
		// similar to the CONJUNCTION_AND, but we need to take care of the SelectionVectors (OR all of them)
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		idx_t count_total = 0;
		SelectionVector result_sel(approved_tuple_count);
		auto &conjunction_or = filter.Cast<ConjunctionOrFilter>();
		for (idx_t child_idx = 0; child_idx < conjunction_or.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_or.child_filters[child_idx];
			SelectionVector temp_sel;
			temp_sel.Initialize(sel);
			idx_t temp_tuple_count = approved_tuple_count;
			idx_t temp_count = FilterSelection(temp_sel, vector, vdata, child_filter, *state.child_states[child_idx],
			                                   scan_count, temp_tuple_count);
			// tuples passed, move them into the actual result vector
			for (idx_t i = 0; i < temp_count; i++) {
				auto new_idx = temp_sel.get_index(i);
				bool is_new_idx = true;
				for (idx_t res_idx = 0; res_idx < count_total; res_idx++) {
					if (result_sel.get_index(res_idx) == new_idx) {
						is_new_idx = false;
						break;
					}
				}
				if (is_new_idx) {
					result_sel.set_index(count_total++, new_idx);
				}
			}
		}
		sel.Initialize(result_sel);
		approved_tuple_count = count_total;
		return approved_tuple_count;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction_and.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_and.child_filters[child_idx];
			FilterSelection(sel, vector, vdata, child_filter, *state.child_states[child_idx], scan_count,
			                approved_tuple_count);
		}
		return approved_tuple_count;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		switch (vector.GetType().InternalType()) {
		case PhysicalType::UINT8: {
			auto predicate = UTinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint8_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT16: {
			auto predicate = USmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint16_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT32: {
			auto predicate = UIntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint32_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT64: {
			auto predicate = UBigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint64_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT8: {
			auto predicate = TinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int8_t>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT16: {
			auto predicate = SmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int16_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT32: {
			auto predicate = IntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int32_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT64: {
			auto predicate = BigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int64_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT128: {
			auto predicate = HugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<hugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                 constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT128: {
			auto predicate = UhugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uhugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                  constant_filter.comparison_type);
			break;
		}
		case PhysicalType::FLOAT: {
			auto predicate = FloatValue::Get(constant_filter.constant);
			FilterSelectionSwitch<float>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::DOUBLE: {
			auto predicate = DoubleValue::Get(constant_filter.constant);
			FilterSelectionSwitch<double>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::VARCHAR: {
			auto predicate = string_t(StringValue::Get(constant_filter.constant));
			FilterSelectionSwitch<string_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::BOOL: {
			auto predicate = BooleanValue::Get(constant_filter.constant);
			FilterSelectionSwitch<bool>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		default:
			throw InvalidTypeException(vector.GetType(), "Invalid type for filter pushed down to table comparison");
		}
		return approved_tuple_count;
	}
	case TableFilterType::IS_NULL: {
		return TemplatedNullSelection<true>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::IS_NOT_NULL: {
		return TemplatedNullSelection<false>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		// Apply the filter on the child vector
		auto &child_vec = StructVector::GetEntries(vector)[struct_filter.child_idx];
		UnifiedVectorFormat child_data;
		child_vec->ToUnifiedFormat(scan_count, child_data);
		return FilterSelection(sel, *child_vec, child_data, *struct_filter.child_filter, filter_state, scan_count,
		                       approved_tuple_count);
	}
	case TableFilterType::EXPRESSION_FILTER: {
		auto &state = filter_state.Cast<ExpressionFilterState>();
		SelectionVector result_sel(approved_tuple_count);
		if (scan_count > STANDARD_VECTOR_SIZE) {
			// scan count is > vector size - split up the vector into multiple chunks
			idx_t offset = 0;
			idx_t result_offset = 0;
			idx_t current_sel_offset = 0;
			SelectionVector current_sel(approved_tuple_count);
			while (offset < scan_count) {
				idx_t chunk_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, scan_count - offset);
				idx_t chunk_end = offset + chunk_count;
				DataChunk chunk;
				chunk.data.emplace_back(vector, offset, chunk_end);
				chunk.SetCardinality(chunk_count);

				// construct the relevant selection vector for the current chunk (offset ... offset + chunk_count)
				idx_t current_count = 0;
				for (; current_sel_offset < approved_tuple_count; current_sel_offset++) {
					auto sel_index = sel.get_index(current_sel_offset);
					if (sel_index >= chunk_end) {
						// exhausted the chunk
						break;
					}
					if (sel_index < offset) {
						throw InternalException("sel_index < offset in expression filter");
					}
					current_sel.set_index(current_count++, sel_index - offset);
				}
				if (current_count == 0) {
					// no matching tuples in this chunk
					offset += chunk_count;
					continue;
				}
				auto current_result_data = result_sel.data() + result_offset;
				SelectionVector current_result_sel(current_result_data);
				idx_t new_matches =
				    state.executor.SelectExpression(chunk, current_result_sel, current_sel, current_count);
				// increment all matches by the offset
				for (idx_t i = 0; i < new_matches; i++) {
					current_result_data[i] += offset;
				}
				result_offset += new_matches;
				offset += chunk_count;
			}
			approved_tuple_count = result_offset;
		} else {
			// standard case: we can handle everything at once - run the expression once
			DataChunk chunk;
			chunk.data.emplace_back(vector);
			chunk.SetCardinality(scan_count);
			approved_tuple_count = state.executor.SelectExpression(chunk, result_sel, sel, approved_tuple_count);
		}
		sel.Initialize(result_sel);
		return approved_tuple_count;
	}
	default:
		throw InternalException("FIXME: unsupported type for filter selection");
	}
}